

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O3

void __thiscall
vkt::texture::anon_unknown_0::TextureCubeLodControlTestInstance::~TextureCubeLodControlTestInstance
          (TextureCubeLodControlTestInstance *this)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  pointer pPVar3;
  
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__TextureCubeLodControlTestInstance_00d38dd0;
  util::TextureRenderer::~TextureRenderer(&this->m_renderer);
  pSVar2 = (this->m_texture).m_state;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar2->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (this->m_texture).m_ptr = (TestTextureCube *)0x0;
      (*((this->m_texture).m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((this->m_texture).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar2 = (this->m_texture).m_state;
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        (*pSVar2->_vptr_SharedPtrStateBase[1])();
      }
      (this->m_texture).m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pPVar3 = (this->m_testParameters).super_TextureCubeTestCaseParameters.
           super_TextureCommonTestCaseParameters.programs.
           super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pPVar3 != (pointer)0x0) {
    operator_delete(pPVar3,(long)(this->m_testParameters).super_TextureCubeTestCaseParameters.
                                 super_TextureCommonTestCaseParameters.programs.
                                 super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pPVar3);
    return;
  }
  return;
}

Assistant:

TextureCubeLodControlTestInstance::~TextureCubeLodControlTestInstance (void)
{
}